

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall hypermind::Lexer::ParseNumber(Lexer *this)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  Value local_20;
  Lexer *local_10;
  Lexer *this_local;
  
  (this->mCurrentToken).type = Number;
  (this->mCurrentToken).start = this->mSource + this->mPosition;
  (this->mCurrentToken).length = 0;
  (this->mCurrentToken).line = this->mLine;
  local_10 = this;
  Value::Value(&local_20,Undefined);
  (this->mCurrentToken).value.type = local_20.type;
  *(undefined4 *)&(this->mCurrentToken).value.field_0x4 = local_20._4_4_;
  (this->mCurrentToken).value.field_1 = local_20.field_1;
  do {
    this->mPosition = this->mPosition + 1;
    bVar1 = IsNumber(this->mSource[this->mPosition]);
    bVar3 = true;
    if (!bVar1) {
      bVar3 = this->mSource[this->mPosition] == '.';
    }
  } while (bVar3);
  (this->mCurrentToken).length =
       ((int)this->mSource + this->mPosition) - (int)(this->mCurrentToken).start;
  (this->mCurrentToken).value.type = Integer;
  iVar2 = atoi((this->mCurrentToken).start);
  (this->mCurrentToken).value.field_1.intval = iVar2;
  return;
}

Assistant:

void Lexer::ParseNumber() {
        // TODO 浮点数的支持
        TOKEN(TokenType::Number, 0);
        do {
            NEXT();
        } while (IsNumber(CURRENT_CHAR) || CURRENT_CHAR == _HM_C('.'));
        TOKEN_LENGTH((HMUINT32)(CURRENT_POS - TOKEN_START));
        mCurrentToken.value.type = ValueType::Integer;
        mCurrentToken.value.intval = (int) hm_strtoi(mCurrentToken.start);
    }